

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

Var Js::JavascriptString::EntrySubstring(RecyclableObject *function,CallInfo callInfo,...)

{
  charcount_t cVar1;
  code *pcVar2;
  bool bVar3;
  int n;
  CallFlags e;
  BOOL BVar4;
  ScriptContext *pSVar5;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar6;
  Var pvVar7;
  int *piVar8;
  charcount_t *pcVar9;
  charcount_t local_88;
  charcount_t local_84;
  int local_6c [3];
  charcount_t local_60;
  int idxEnd;
  int idxStart;
  int len;
  JavascriptString *pThis;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar5,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar3 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x7cc,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pThis = (JavascriptString *)RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar3 = operator!(e);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,1999,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  _idxStart = (CallInfo)0x0;
  GetThisStringArgument
            ((ArgumentReader *)&scriptContext,(ScriptContext *)pThis,L"String.prototype.substring",
             (JavascriptString **)&idxStart);
  local_6c[2] = GetLength((JavascriptString *)_idxStart);
  local_60 = 0;
  idxEnd = local_6c[2];
  if (((uint)scriptContext & 0xffffff) != 1 && ((ulong)scriptContext & 0xffffff) != 0) {
    pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,1);
    BVar4 = Js::JavascriptOperators::IsUndefinedObject(pvVar7);
    if (BVar4 == 0) {
      pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,1);
      local_84 = ConvertToIndex(pvVar7,(ScriptContext *)pThis);
    }
    else {
      local_84 = 0;
    }
    local_60 = local_84;
    if (2 < ((uint)scriptContext & 0xffffff)) {
      pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,2);
      BVar4 = Js::JavascriptOperators::IsUndefinedObject(pvVar7);
      if (BVar4 == 0) {
        pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,2);
        local_88 = ConvertToIndex(pvVar7,(ScriptContext *)pThis);
      }
      else {
        local_88 = idxEnd;
      }
      local_6c[2] = local_88;
    }
  }
  local_6c[1] = 0;
  piVar8 = max<int>((int *)&local_60,local_6c + 1);
  pcVar9 = (charcount_t *)min<int>(piVar8,&idxEnd);
  local_60 = *pcVar9;
  local_6c[0] = 0;
  piVar8 = max<int>(local_6c + 2,local_6c);
  pcVar9 = (charcount_t *)min<int>(piVar8,&idxEnd);
  cVar1 = *pcVar9;
  local_6c[2] = cVar1;
  if ((int)cVar1 < (int)local_60) {
    local_6c[2] = local_60;
    local_60 = cVar1;
  }
  if ((local_60 == 0) && (local_6c[2] == idxEnd)) {
    callInfo_local = _idxStart;
  }
  else {
    _idxStart = (CallInfo)BreakSpeculation(_idxStart);
    callInfo_local =
         (CallInfo)
         SubstringCore((JavascriptString *)_idxStart,local_60,local_6c[2] - local_60,
                       (ScriptContext *)pThis);
  }
  return (Var)callInfo_local;
}

Assistant:

Var JavascriptString::EntrySubstring(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        JavascriptString * pThis = nullptr;
        GetThisStringArgument(args, scriptContext, _u("String.prototype.substring"), &pThis);

        int len = pThis->GetLength();

        int idxStart = 0;
        int idxEnd = len;

        if (args.Info.Count > 1)
        {
            idxStart = JavascriptOperators::IsUndefinedObject(args[1]) ? 0 : ConvertToIndex(args[1], scriptContext);
            if (args.Info.Count > 2)
            {
                idxEnd = JavascriptOperators::IsUndefinedObject(args[2]) ? len : ConvertToIndex(args[2], scriptContext);
            }
        }

        idxStart = min(max(idxStart, 0), len);
        idxEnd = min(max(idxEnd, 0), len);
        if(idxEnd < idxStart)
        {
            //swap
            idxStart ^= idxEnd;
            idxEnd ^= idxStart;
            idxStart ^= idxEnd;
        }

        if (idxStart == 0 && idxEnd == len)
        {
            //return the string if we need to substring entire span
            return pThis;
        }

#ifdef ENABLE_SPECTRE_RUNTIME_MITIGATIONS
        pThis = (JavascriptString*)BreakSpeculation(pThis);
#endif

        return SubstringCore(pThis, idxStart, idxEnd - idxStart, scriptContext);
    }